

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eigenvalue.hpp
# Opt level: O3

void __thiscall JAMA::Eigenvalue<double>::tred2(Eigenvalue<double> *this)

{
  double *pdVar1;
  double **ppdVar2;
  double *pdVar3;
  pointer __s;
  int j_2;
  uint uVar4;
  int k;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  pointer pdVar8;
  int j;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  int j_4;
  ulong uVar12;
  int k_3;
  long lVar13;
  uint uVar14;
  long lVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  
  uVar14 = this->n;
  lVar15 = (long)(int)uVar14;
  if (0 < lVar15) {
    pdVar8 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar1 = (this->V).data_[lVar15 + -1];
    lVar6 = 0;
    do {
      pdVar8[lVar6] = pdVar1[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar15 != lVar6);
    if (uVar14 != 1) {
      uVar11 = (ulong)(uVar14 - 1);
      uVar12 = 0;
      uVar9 = uVar11;
      do {
        lVar6 = lVar15 + -1;
        uVar5 = 0;
        dVar18 = 0.0;
        do {
          dVar18 = dVar18 + ABS((this->d).data_.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar5]);
          uVar5 = uVar5 + 1;
        } while (uVar9 != uVar5);
        if ((dVar18 != 0.0) || (NAN(dVar18))) {
          pdVar8 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar19 = 0.0;
          uVar5 = 0;
          do {
            dVar16 = pdVar8[uVar5] / dVar18;
            pdVar8[uVar5] = dVar16;
            dVar19 = dVar19 + dVar16 * dVar16;
            uVar5 = uVar5 + 1;
          } while (uVar9 != uVar5);
          dVar16 = pdVar8[lVar15 + -2];
          if (dVar19 < 0.0) {
            dVar17 = sqrt(dVar19);
          }
          else {
            dVar17 = SQRT(dVar19);
          }
          lVar13 = lVar15 + -2;
          dVar17 = (double)(~-(ulong)(0.0 < dVar16) & (ulong)dVar17 |
                           (ulong)-dVar17 & -(ulong)(0.0 < dVar16));
          __s = (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
          __s[lVar6] = dVar18 * dVar17;
          dVar19 = dVar19 - dVar16 * dVar17;
          pdVar8 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar8[lVar15 + -2] = dVar16 - dVar17;
          memset(__s,0,(uVar11 - uVar12) * 8);
          ppdVar2 = (this->V).data_;
          uVar5 = 0;
          do {
            dVar18 = pdVar8[uVar5];
            pdVar1 = ppdVar2[uVar5];
            pdVar1[lVar6] = dVar18;
            dVar16 = pdVar1[uVar5] * dVar18 + __s[uVar5];
            for (uVar7 = uVar5; (long)uVar7 < lVar13; uVar7 = uVar7 + 1) {
              dVar17 = ppdVar2[uVar7 + 1][uVar5];
              dVar16 = dVar16 + pdVar8[uVar7 + 1] * dVar17;
              __s[uVar7 + 1] = dVar17 * dVar18 + __s[uVar7 + 1];
            }
            __s[uVar5] = dVar16;
            uVar5 = uVar5 + 1;
          } while (uVar5 != uVar9);
          dVar18 = 0.0;
          uVar5 = 0;
          do {
            dVar16 = __s[uVar5];
            __s[uVar5] = dVar16 / dVar19;
            dVar18 = dVar18 + (dVar16 / dVar19) * pdVar8[uVar5];
            uVar5 = uVar5 + 1;
          } while (uVar9 != uVar5);
          uVar5 = 0;
          do {
            __s[uVar5] = pdVar8[uVar5] * (-dVar18 / (dVar19 + dVar19)) + __s[uVar5];
            uVar5 = uVar5 + 1;
          } while (uVar9 != uVar5);
          ppdVar2 = (this->V).data_;
          pdVar1 = ppdVar2[lVar15 + -2];
          pdVar3 = ppdVar2[lVar6];
          lVar15 = -1;
          uVar5 = 0;
          do {
            if ((long)uVar5 <= lVar13) {
              dVar18 = pdVar8[uVar5];
              dVar16 = __s[uVar5];
              lVar10 = lVar15;
              do {
                ppdVar2[lVar10 + 1][uVar5] =
                     ppdVar2[lVar10 + 1][uVar5] -
                     (__s[lVar10 + 1] * dVar18 + pdVar8[lVar10 + 1] * dVar16);
                lVar10 = lVar10 + 1;
              } while (lVar10 < lVar13);
            }
            pdVar8[uVar5] = pdVar1[uVar5];
            pdVar3[uVar5] = 0.0;
            uVar5 = uVar5 + 1;
            lVar15 = lVar15 + 1;
          } while (uVar5 != uVar9);
        }
        else {
          pdVar8 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar6] = pdVar8[lVar15 + -2];
          ppdVar2 = (this->V).data_;
          pdVar1 = ppdVar2[lVar15 + -2];
          pdVar3 = ppdVar2[lVar6];
          uVar5 = 0;
          do {
            pdVar8[uVar5] = pdVar1[uVar5];
            pdVar3[uVar5] = 0.0;
            ppdVar2[uVar5][lVar6] = 0.0;
            uVar5 = uVar5 + 1;
          } while (uVar9 != uVar5);
          dVar19 = 0.0;
        }
        pdVar8[lVar6] = dVar19;
        uVar9 = uVar9 - 1;
        uVar12 = uVar12 + 1;
        lVar15 = lVar6;
      } while (uVar12 != uVar11);
      uVar14 = this->n;
      uVar4 = uVar14 - 1;
      if (1 < (int)uVar14) {
        pdVar8 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        ppdVar2 = (this->V).data_;
        pdVar1 = ppdVar2[uVar4];
        lVar15 = 1;
        uVar9 = 0;
        do {
          pdVar3 = ppdVar2[uVar9];
          pdVar1[uVar9] = pdVar3[uVar9];
          pdVar3[uVar9] = 1.0;
          dVar18 = pdVar8[uVar9 + 1];
          uVar9 = uVar9 + 1;
          if ((dVar18 != 0.0) || (NAN(dVar18))) {
            lVar6 = 0;
            do {
              pdVar8[lVar6] = ppdVar2[lVar6][uVar9] / dVar18;
              lVar6 = lVar6 + 1;
            } while (lVar15 != lVar6);
            lVar6 = 0;
            do {
              dVar18 = 0.0;
              lVar13 = 0;
              do {
                dVar18 = dVar18 + ppdVar2[lVar13][uVar9] * ppdVar2[lVar13][lVar6];
                lVar13 = lVar13 + 1;
              } while (lVar15 != lVar13);
              lVar13 = 0;
              do {
                ppdVar2[lVar13][lVar6] = pdVar8[lVar13] * -dVar18 + ppdVar2[lVar13][lVar6];
                lVar13 = lVar13 + 1;
              } while (lVar15 != lVar13);
              lVar6 = lVar6 + 1;
            } while (lVar6 != lVar15);
          }
          lVar6 = 0;
          do {
            ppdVar2[lVar6][uVar9] = 0.0;
            lVar6 = lVar6 + 1;
          } while (lVar15 != lVar6);
          lVar15 = lVar15 + 1;
        } while (uVar9 != uVar4);
      }
      goto LAB_0022509f;
    }
  }
  uVar4 = uVar14 - 1;
LAB_0022509f:
  pdVar1 = (this->V).data_[uVar4];
  if (0 < (int)uVar14) {
    pdVar8 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = 0;
    do {
      pdVar8[uVar9] = pdVar1[uVar9];
      pdVar1[uVar9] = 0.0;
      uVar9 = uVar9 + 1;
    } while (uVar14 != uVar9);
  }
  pdVar1[uVar4] = 1.0;
  *(this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
   super__Vector_impl_data._M_start = 0.0;
  return;
}

Assistant:

void tred2() {
      //  This is derived from the Algol procedures tred2 by
      //  Bowdler, Martin, Reinsch, and Wilkinson, Handbook for
      //  Auto. Comp., Vol.ii-Linear Algebra, and the corresponding
      //  Fortran subroutine in EISPACK.

      for (int j = 0; j < n; j++) {
        d(j) = V(n - 1, j);
      }

      // Householder reduction to tridiagonal form.

      for (int i = n - 1; i > 0; i--) {
        // Scale to avoid under/overflow.

        Real scale = 0.0;
        Real h     = 0.0;
        for (int k = 0; k < i; k++) {
          scale = scale + abs(d(k));
        }
        if (scale == 0.0) {
          e(i) = d(i - 1);
          for (int j = 0; j < i; j++) {
            d(j)    = V(i - 1, j);
            V(i, j) = 0.0;
            V(j, i) = 0.0;
          }
        } else {
          // Generate Householder vector.

          for (int k = 0; k < i; k++) {
            d(k) /= scale;
            h += d(k) * d(k);
          }
          Real f = d(i - 1);
          Real g = sqrt(h);
          if (f > 0) { g = -g; }
          e(i)     = scale * g;
          h        = h - f * g;
          d(i - 1) = f - g;
          for (int j = 0; j < i; j++) {
            e(j) = 0.0;
          }

          // Apply similarity transformation to remaining columns.

          for (int j = 0; j < i; j++) {
            f       = d(j);
            V(j, i) = f;
            g       = e(j) + V(j, j) * f;
            for (int k = j + 1; k <= i - 1; k++) {
              g += V(k, j) * d(k);
              e(k) += V(k, j) * f;
            }
            e(j) = g;
          }
          f = 0.0;
          for (int j = 0; j < i; j++) {
            e(j) /= h;
            f += e(j) * d(j);
          }
          Real hh = f / (h + h);
          for (int j = 0; j < i; j++) {
            e(j) -= hh * d(j);
          }
          for (int j = 0; j < i; j++) {
            f = d(j);
            g = e(j);
            for (int k = j; k <= i - 1; k++) {
              V(k, j) -= (f * e(k) + g * d(k));
            }
            d(j)    = V(i - 1, j);
            V(i, j) = 0.0;
          }
        }
        d(i) = h;
      }

      // Accumulate transformations.

      for (int i = 0; i < n - 1; i++) {
        V(n - 1, i) = V(i, i);
        V(i, i)     = 1.0;
        Real h      = d(i + 1);
        if (h != 0.0) {
          for (int k = 0; k <= i; k++) {
            d(k) = V(k, i + 1) / h;
          }
          for (int j = 0; j <= i; j++) {
            Real g = 0.0;
            for (int k = 0; k <= i; k++) {
              g += V(k, i + 1) * V(k, j);
            }
            for (int k = 0; k <= i; k++) {
              V(k, j) -= g * d(k);
            }
          }
        }
        for (int k = 0; k <= i; k++) {
          V(k, i + 1) = 0.0;
        }
      }
      for (int j = 0; j < n; j++) {
        d(j)        = V(n - 1, j);
        V(n - 1, j) = 0.0;
      }
      V(n - 1, n - 1) = 1.0;
      e(0)            = 0.0;
    }